

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall
Database::commit_task
          (Database *this,TaskSpec *spec,vector<DBChange,_std::allocator<DBChange>_> *changes)

{
  int iVar1;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  long *plVar2;
  logger *plVar3;
  OnDiskDataset *this_00;
  long lVar4;
  int *piVar5;
  ulonglong uVar6;
  ulonglong file_offset;
  runtime_error *prVar7;
  undefined8 uVar8;
  uint *puVar9;
  DbChangeType *pDVar10;
  _Alloc_hider _Var11;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view value;
  string param;
  DatabaseName itname;
  long *local_1d8;
  ConfigKey *pCStack_1d0;
  long local_1c8 [2];
  long *local_1b8;
  undefined8 uStack_1b0;
  long local_1a8 [3];
  long *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  path *local_180;
  undefined1 local_178 [56];
  bool local_140;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  pointer local_d8;
  vector<DBChange,_std::allocator<DBChange>_> *local_d0;
  DatabaseConfig *local_c8;
  Database *local_c0;
  DbChangeType *local_b8;
  path local_b0;
  path local_70;
  
  _Var11._M_p = (pointer)spec->id_;
  pDVar10 = *(DbChangeType **)changes;
  local_b8 = *(DbChangeType **)(changes + 8);
  local_d0 = changes;
  if (pDVar10 != local_b8) {
    local_c8 = &this->config_;
    local_180 = &this->db_base;
    local_188 = &local_e8;
    local_d8 = _Var11._M_p;
    local_c0 = this;
    do {
      if (*(undefined8 *)(pDVar10 + 0xc) == 0) {
        db_change_to_string_abi_cxx11_((string *)local_178,*pDVar10);
        plVar3 = spdlog::default_logger_raw();
        local_1d8 = (long *)0x0;
        pCStack_1d0 = (ConfigKey *)0x0;
        local_1c8[0] = 0;
        loc_00.funcname = (char *)0x0;
        loc_00.filename = (char *)0x0;
        loc_00.line = 0;
        loc_00._12_4_ = 0;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = "CHANGE: {} {}";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string>
                  (plVar3,loc_00,info,fmt_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pDVar10 + 2));
      }
      else {
        db_change_to_string_abi_cxx11_((string *)local_178,*pDVar10);
        plVar3 = spdlog::default_logger_raw();
        local_1d8 = (long *)0x0;
        pCStack_1d0 = (ConfigKey *)0x0;
        local_1c8[0] = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0x12;
        fmt.data_ = "CHANGE: {} {} ({})";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (plVar3,loc,info,fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pDVar10 + 2),(string *)(pDVar10 + 10));
      }
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      puVar9 = &switchD_0012243f::switchdataD_00196580;
      switch(*pDVar10) {
      case Insert:
        goto LAB_0012250f;
      case Drop:
        drop_dataset(this,(string *)(pDVar10 + 2));
        break;
      case Reload:
        drop_dataset(this,(string *)(pDVar10 + 2));
LAB_0012250f:
        load_dataset(this,(string *)(pDVar10 + 2));
        break;
      case ToggleTaint:
        this_00 = find_working_dataset(this,(string *)(pDVar10 + 2));
        if (this_00 == (OnDiskDataset *)0x0) {
          plVar3 = spdlog::default_logger_raw();
          local_178._0_8_ = (pointer)0x0;
          local_178._8_8_ = 0;
          local_178._16_8_ = 0;
          loc_02.funcname = (char *)0x0;
          loc_02.filename = (char *)0x0;
          loc_02.line = 0;
          loc_02._12_4_ = 0;
          spdlog::logger::log<char[41],_nullptr>
                    (plVar3,loc_02,warn,(char (*) [41])"ToggleTaint failed - nonexistent dataset");
        }
        else {
          OnDiskDataset::toggle_taint(this_00,(string *)(pDVar10 + 10));
          OnDiskDataset::save(this_00);
        }
        break;
      case NewIterator:
        std::experimental::filesystem::v1::__cxx11::path::path(&local_70,local_180);
        DatabaseName::parse((DatabaseName *)local_178,&local_70,(string *)(pDVar10 + 2));
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
        load_iterator(this,(DatabaseName *)local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != local_188) {
LAB_00122493:
          operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
        }
        goto LAB_001224a3;
      case UpdateIterator:
        std::experimental::filesystem::v1::__cxx11::path::path(&local_b0,local_180);
        DatabaseName::parse((DatabaseName *)local_178,&local_b0,(string *)(pDVar10 + 2));
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,*(undefined8 *)(pDVar10 + 10),
                   *(undefined8 *)(pDVar10 + 0xc) + *(undefined8 *)(pDVar10 + 10));
        lVar4 = std::__cxx11::string::find((char)(string *)&local_1d8,0x3a);
        if (lVar4 == -1) goto LAB_00122959;
        std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_1d8);
        plVar2 = local_1b8;
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtoull((char *)plVar2,(char **)&local_190,10);
        if (local_190 == plVar2) goto LAB_0012294d;
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) goto LAB_00122997;
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_1d8);
        plVar2 = local_1b8;
        iVar1 = *piVar5;
        *piVar5 = 0;
        file_offset = strtoull((char *)local_1b8,(char **)&local_190,10);
        if (local_190 == plVar2) goto LAB_00122941;
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) goto LAB_001229a3;
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        this = local_c0;
        update_iterator(local_c0,(DatabaseName *)local_178,uVar6,file_offset);
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != local_188) goto LAB_00122493;
LAB_001224a3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p != &local_108) {
          operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_p != &local_128) {
          operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
        }
        std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_178);
        break;
      case ConfigChange:
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,*(undefined8 *)(pDVar10 + 2),
                   *(undefined8 *)(pDVar10 + 4) + *(undefined8 *)(pDVar10 + 2));
        _Var11._M_p = *(pointer *)(pDVar10 + 10);
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtoull(_Var11._M_p,(char **)local_178,10);
        if ((pointer)local_178._0_8_ == _Var11._M_p) {
          std::__throw_invalid_argument("stoull");
LAB_00122941:
          std::__throw_invalid_argument("stoull");
LAB_0012294d:
          std::__throw_invalid_argument("stoull");
LAB_00122959:
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Invalid iterator update parameter");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stoull");
LAB_00122997:
          std::__throw_out_of_range("stoull");
LAB_001229a3:
          uVar8 = std::__throw_out_of_range("stoull");
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          DatabaseName::~DatabaseName((DatabaseName *)local_178);
          _Unwind_Resume(uVar8);
        }
        value._M_str = (char *)puVar9;
        value._M_len = (size_t)local_1d8;
        ConfigKey::parse((optional<ConfigKey> *)local_178,pCStack_1d0,value);
        if (local_140 == true) {
          DatabaseConfig::set(local_c8,(ConfigKey *)local_178,uVar6);
        }
        else {
          plVar3 = spdlog::default_logger_raw();
          local_1b8 = (long *)0x0;
          uStack_1b0 = 0;
          local_1a8[0] = 0;
          loc_01.funcname = (char *)0x0;
          loc_01.filename = (char *)0x0;
          loc_01.line = 0;
          loc_01._12_4_ = 0;
          spdlog::logger::log<char[36],_nullptr>
                    (plVar3,loc_01,err,(char (*) [36])"Invalid key name in DbChange - bug?");
        }
        if ((local_140 == true) &&
           (local_140 = false, (undefined1 *)local_178._0_8_ != local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        break;
      default:
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"unknown change type requested");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _Var11._M_p = local_d8;
      pDVar10 = pDVar10 + 0x12;
    } while (pDVar10 != local_b8);
    if (*(long *)local_d0 != *(long *)(local_d0 + 8)) {
      save(this);
    }
  }
  local_178._0_8_ = _Var11._M_p;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->tasks)._M_h);
  return;
}

Assistant:

void Database::commit_task(const TaskSpec &spec,
                           const std::vector<DBChange> &changes) {
    uint64_t task_id = spec.id();

    for (const auto &change : changes) {
        if (change.parameter.empty()) {
            spdlog::info("CHANGE: {} {}", db_change_to_string(change.type),
                         change.obj_name);
        } else {
            spdlog::info("CHANGE: {} {} ({})", db_change_to_string(change.type),
                         change.obj_name, change.parameter);
        }
        if (change.type == DbChangeType::Insert) {
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Drop) {
            drop_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Reload) {
            drop_dataset(change.obj_name);
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::ToggleTaint) {
            OnDiskDataset *ds = find_working_dataset(change.obj_name);
            if (ds == nullptr) {
                spdlog::warn("ToggleTaint failed - nonexistent dataset");
                continue;  // suspicious, but maybe task was delayed?
            }
            ds->toggle_taint(change.parameter);
            ds->save();
        } else if (change.type == DbChangeType::NewIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            load_iterator(itname);
        } else if (change.type == DbChangeType::UpdateIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            std::string param = change.parameter;
            size_t split_loc = param.find(':');
            if (split_loc == std::string::npos) {
                throw std::runtime_error("Invalid iterator update parameter");
            }
            uint64_t new_bytes = std::stoull(param.substr(0, split_loc));
            uint64_t new_files = std::stoull(param.substr(split_loc + 1));
            update_iterator(itname, new_bytes, new_files);
        } else if (change.type == DbChangeType::ConfigChange) {
            std::string keyname = change.obj_name;
            uint64_t value = std::stoull(change.parameter);
            auto key = ConfigKey::parse(keyname);
            if (key) {
                config_.set(*key, value);
            } else {
                spdlog::error("Invalid key name in DbChange - bug?");
            }
        } else {
            throw std::runtime_error("unknown change type requested");
        }
    }

    if (!changes.empty()) {
        save();
    }

    erase_task(task_id);
}